

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

void stbrp_init_target(stbrp_context *context,int width,int height,stbrp_node *nodes,int num_nodes)

{
  int local_28;
  int i;
  int num_nodes_local;
  stbrp_node *nodes_local;
  int height_local;
  int width_local;
  stbrp_context *context_local;
  
  if (0xffff < width || 0xffff < height) {
    __assert_fail("width <= 0xffff && height <= 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imstb_rectpack.h"
                  ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
  }
  for (local_28 = 0; local_28 < num_nodes + -1; local_28 = local_28 + 1) {
    nodes[local_28].next = nodes + (local_28 + 1);
  }
  nodes[local_28].next = (stbrp_node *)0x0;
  context->init_mode = 1;
  context->heuristic = 0;
  context->free_head = nodes;
  context->active_head = context->extra;
  context->width = width;
  context->height = height;
  context->num_nodes = num_nodes;
  stbrp_setup_allow_out_of_mem(context,0);
  context->extra[0].x = 0;
  context->extra[0].y = 0;
  context->extra[0].next = context->extra + 1;
  context->extra[1].x = (stbrp_coord)width;
  context->extra[1].y = 0xffff;
  context->extra[1].next = (stbrp_node *)0x0;
  return;
}

Assistant:

STBRP_DEF void stbrp_init_target(stbrp_context *context, int width, int height, stbrp_node *nodes, int num_nodes)
{
   int i;
#ifndef STBRP_LARGE_RECTS
   STBRP_ASSERT(width <= 0xffff && height <= 0xffff);
#endif

   for (i=0; i < num_nodes-1; ++i)
      nodes[i].next = &nodes[i+1];
   nodes[i].next = NULL;
   context->init_mode = STBRP__INIT_skyline;
   context->heuristic = STBRP_HEURISTIC_Skyline_default;
   context->free_head = &nodes[0];
   context->active_head = &context->extra[0];
   context->width = width;
   context->height = height;
   context->num_nodes = num_nodes;
   stbrp_setup_allow_out_of_mem(context, 0);

   // node 0 is the full width, node 1 is the sentinel (lets us not store width explicitly)
   context->extra[0].x = 0;
   context->extra[0].y = 0;
   context->extra[0].next = &context->extra[1];
   context->extra[1].x = (stbrp_coord) width;
#ifdef STBRP_LARGE_RECTS
   context->extra[1].y = (1<<30);
#else
   context->extra[1].y = 65535;
#endif
   context->extra[1].next = NULL;
}